

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall
FlowGraph::RemoveUnreachableBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar3;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  undefined4 *puVar5;
  Type_conflict node;
  Type *ppFVar6;
  BasicBlock *pBVar7;
  BasicBlock *pred;
  FlowEdge **__edge;
  Iterator __iter;
  bool isDead;
  GlobOpt *globOpt_local;
  BasicBlock *block_local;
  FlowGraph *this_local;
  
  __iter.current._7_1_ = 0;
  pSVar3 = BasicBlock::GetPredList(block);
  if (pSVar3 == (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)0x0) {
LAB_00537e56:
    if (block != this->func->m_fg->blockList) {
      __iter.current._7_1_ = 1;
      goto LAB_00538045;
    }
  }
  else {
    pSVar4 = &BasicBlock::GetPredList(block)->
              super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Empty(pSVar4);
    if (bVar2) goto LAB_00537e56;
  }
  if ((*(ushort *)&block->field_0x18 >> 2 & 1) != 0) {
    __iter.current._7_1_ = 1;
    pSVar4 = &BasicBlock::GetPredList(block)->
              super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar4);
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_00 = __edge;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&__edge);
      pBVar7 = FlowEdge::GetPred(*ppFVar6);
      if (pBVar7 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x98c,"(pred)","pred");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = Loop::IsDescendentOrSelf(block->loop,pBVar7->loop);
      if (!bVar2) {
        __iter.current._7_1_ = 0;
      }
    }
  }
LAB_00538045:
  bVar2 = (__iter.current._7_1_ & 1) != 0;
  if (bVar2) {
    RemoveBlock(this,block,globOpt,false);
  }
  return bVar2;
}

Assistant:

bool
FlowGraph::RemoveUnreachableBlock(BasicBlock *block, GlobOpt * globOpt)
{
    bool isDead = false;

    if ((block->GetPredList() == nullptr || block->GetPredList()->Empty()) && block != this->func->m_fg->blockList)
    {
        isDead = true;
    }
    else if (block->isLoopHeader)
    {
        // A dead loop still has back-edges pointing to it...
        isDead = true;
        FOREACH_PREDECESSOR_BLOCK(pred, block)
        {
            if (!block->loop->IsDescendentOrSelf(pred->loop))
            {
                isDead = false;
            }
        } NEXT_PREDECESSOR_BLOCK;
    }

    if (isDead)
    {
        this->RemoveBlock(block, globOpt);
        return true;
    }
    return false;
}